

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
libcellml::Parser::ParserImpl::loadEncapsulation(ParserImpl *this,ModelPtr *model,XmlNodePtr *node)

{
  IssueImpl *pIVar1;
  bool bVar2;
  Component *__tmp;
  undefined8 *puVar3;
  size_t sVar4;
  long *plVar5;
  size_type *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  element_type *peVar8;
  element_type *peVar9;
  ulong *puVar10;
  undefined8 uVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  string textNode;
  IssuePtr issue_2;
  IssuePtr issue;
  ComponentPtr parentComponent;
  string encapsulationId;
  NameList usedNames;
  string local_158;
  string local_138;
  undefined1 local_118 [24];
  pointer puStack_100;
  IssuePtr local_f8;
  element_type local_e8;
  IssuePtr local_d8;
  undefined1 local_c8 [24];
  long local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  ComponentPtr local_78;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  XmlNode::firstChild((XmlNode *)local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    do {
      local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_68 = &local_58;
      local_60 = 0;
      local_58 = 0;
      if (this->mParsing20Version == true) {
        bVar2 = XmlNode::isCellml20Element((XmlNode *)local_c8._0_8_,"component_ref");
      }
      else {
        bVar2 = XmlNode::isCellml1XElement((XmlNode *)local_c8._0_8_,"component_ref");
      }
      if (bVar2 == false) {
        bVar2 = XmlNode::isText((XmlNode *)local_c8._0_8_);
        if (!bVar2) {
          bVar2 = XmlNode::isComment((XmlNode *)local_c8._0_8_);
          if ((!bVar2) &&
             ((this->mParsing1XVersion != true ||
              (bVar2 = XmlNode::isCellml1XElement((XmlNode *)local_c8._0_8_,"relationship_ref"),
              !bVar2)))) {
            Issue::IssueImpl::create();
            pIVar1 = (local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl;
            NamedEntity::name_abi_cxx11_
                      ((string *)&local_98,
                       (NamedEntity *)
                       (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x2a64db);
            local_f8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 &local_e8;
            peVar8 = (element_type *)(plVar5 + 2);
            if ((element_type *)*plVar5 == peVar8) {
              local_e8._vptr_Issue = peVar8->_vptr_Issue;
              local_e8.mPimpl = (IssueImpl *)plVar5[3];
            }
            else {
              local_e8._vptr_Issue = peVar8->_vptr_Issue;
              local_f8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)*plVar5;
            }
            local_f8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
            *plVar5 = (long)peVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            puVar10 = (ulong *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar10) {
              local_138.field_2._M_allocated_capacity = *puVar10;
              local_138.field_2._8_8_ = plVar5[3];
            }
            else {
              local_138.field_2._M_allocated_capacity = *puVar10;
              local_138._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_138._M_string_length = plVar5[1];
            *plVar5 = (long)puVar10;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            XmlNode::name_abi_cxx11_((string *)(local_c8 + 0x10),(XmlNode *)local_c8._0_8_);
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              uVar11 = local_138.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar11 < local_b0 + local_138._M_string_length) {
              uVar11 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._16_8_ != &local_a8) {
                uVar11 = local_a8._M_allocated_capacity;
              }
              if ((ulong)uVar11 < local_b0 + local_138._M_string_length) goto LAB_002343c1;
              puVar3 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)(local_c8 + 0x10),0,(char *)0x0,
                                  (ulong)local_138._M_dataplus._M_p);
            }
            else {
LAB_002343c1:
              puVar3 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_138,local_c8._16_8_);
            }
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            psVar6 = puVar3 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar3 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_158.field_2._M_allocated_capacity = *psVar6;
              local_158.field_2._8_8_ = puVar3[3];
            }
            else {
              local_158.field_2._M_allocated_capacity = *psVar6;
              local_158._M_dataplus._M_p = (pointer)*puVar3;
            }
            local_158._M_string_length = puVar3[1];
            *puVar3 = psVar6;
            puVar3[1] = 0;
            *(undefined1 *)psVar6 = 0;
            puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
            local_118._0_8_ = local_118 + 0x10;
            peVar9 = (element_type *)(puVar3 + 2);
            if ((element_type *)*puVar3 == peVar9) {
              local_118._16_8_ =
                   (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                   super_Entity._vptr_Entity;
              puStack_100 = (pointer)puVar3[3];
            }
            else {
              local_118._16_8_ =
                   (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                   super_Entity._vptr_Entity;
              local_118._0_8_ = (element_type *)*puVar3;
            }
            local_118._8_8_ = puVar3[1];
            *puVar3 = peVar9;
            puVar3[1] = 0;
            *(undefined1 *)(puVar3 + 2) = 0;
            Issue::IssueImpl::setDescription(pIVar1,(string *)local_118);
            if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
              operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._16_8_ != &local_a8) {
              operator_delete((void *)local_c8._16_8_,local_a8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_f8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                &local_e8) {
              operator_delete(local_f8.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,(long)local_e8._vptr_Issue + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_allocated_capacity != &local_88) {
              operator_delete((void *)local_98._M_allocated_capacity,
                              local_88._M_allocated_capacity + 1);
            }
            AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                      ((((local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl->mItem).
                        super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,model);
            Issue::IssueImpl::setReferenceRule
                      ((local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,ENCAPSULATION_CHILD);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_d8);
            if ((pointer)local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
LAB_00234588:
          if (local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              != (element_type *)0x0) goto LAB_00234597;
          goto LAB_002348d1;
        }
        XmlNode::convertToString_abi_cxx11_((string *)local_118,(XmlNode *)local_c8._0_8_);
        bVar2 = hasNonWhitespaceCharacters((string *)local_118);
        if (bVar2) {
          Issue::IssueImpl::create();
          pIVar1 = (local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->mPimpl;
          NamedEntity::name_abi_cxx11_
                    ((string *)(local_c8 + 0x10),
                     (NamedEntity *)
                     (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          plVar5 = (long *)std::__cxx11::string::replace
                                     ((ulong)(local_c8 + 0x10),0,(char *)0x0,0x2a64db);
          local_98._M_allocated_capacity = (size_type)&local_88;
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 == paVar7) {
            local_88._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_88._8_8_ = plVar5[3];
          }
          else {
            local_88._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_98._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar5;
          }
          local_98._8_8_ = plVar5[1];
          *plVar5 = (long)paVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append(local_98._M_local_buf);
          local_f8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_e8;
          peVar8 = (element_type *)(plVar5 + 2);
          if ((element_type *)*plVar5 == peVar8) {
            local_e8._vptr_Issue = peVar8->_vptr_Issue;
            local_e8.mPimpl = (IssueImpl *)plVar5[3];
          }
          else {
            local_e8._vptr_Issue = peVar8->_vptr_Issue;
            local_f8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar5;
          }
          local_f8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
          *plVar5 = (long)peVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,local_118._0_8_);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          puVar10 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_138.field_2._M_allocated_capacity = *puVar10;
            local_138.field_2._8_8_ = plVar5[3];
          }
          else {
            local_138.field_2._M_allocated_capacity = *puVar10;
            local_138._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_138._M_string_length = plVar5[1];
          *plVar5 = (long)puVar10;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar6 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_158.field_2._M_allocated_capacity = *psVar6;
            local_158.field_2._8_8_ = puVar3[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar6;
            local_158._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_158._M_string_length = puVar3[1];
          *puVar3 = psVar6;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar1,&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if (local_f8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_e8) {
            operator_delete(local_f8.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (long)local_e8._vptr_Issue + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_allocated_capacity != &local_88) {
            operator_delete((void *)local_98._M_allocated_capacity,
                            local_88._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._16_8_ != &local_a8) {
            operator_delete((void *)local_c8._16_8_,local_a8._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                    ((((local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,model);
          Issue::IssueImpl::setReferenceRule
                    ((local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,XML_UNEXPECTED_CHARACTER);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_d8);
          _Var12._M_pi = local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
LAB_002342ad:
          if ((pointer)_Var12._M_pi != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var12._M_pi);
          }
        }
        else {
          XmlNode::next((XmlNode *)&local_158);
          uVar11 = local_c8._8_8_;
          local_c8._8_8_ = local_158._M_string_length;
          local_c8._0_8_ = local_158._M_dataplus._M_p;
          local_158._M_dataplus._M_p = (pointer)0x0;
          local_158._M_string_length = 0;
          if ((pointer)uVar11 != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11);
            _Var12._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_158._M_string_length;
            goto LAB_002342ad;
          }
        }
        if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
        }
        if (bVar2) goto LAB_00234588;
      }
      else {
        loadComponentRef((ParserImpl *)local_118,(ModelPtr *)this,(XmlNodePtr *)model,
                         (NameList *)local_c8);
        _Var12._M_pi = local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
        local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_118._0_8_;
        local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
        if ((pointer)_Var12._M_pi != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var12._M_pi);
        }
        if (local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          Issue::IssueImpl::create();
          pIVar1 = (local_f8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->mPimpl;
          NamedEntity::name_abi_cxx11_
                    (&local_138,
                     (NamedEntity *)
                     (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x2a64db);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar6 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_158.field_2._M_allocated_capacity = *psVar6;
            local_158.field_2._8_8_ = puVar3[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar6;
            local_158._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_158._M_string_length = puVar3[1];
          *puVar3 = psVar6;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
          local_118._0_8_ = local_118 + 0x10;
          peVar9 = (element_type *)(puVar3 + 2);
          if ((element_type *)*puVar3 == peVar9) {
            local_118._16_8_ =
                 (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity
                 ._vptr_Entity;
            puStack_100 = (pointer)puVar3[3];
          }
          else {
            local_118._16_8_ =
                 (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity
                 ._vptr_Entity;
            local_118._0_8_ = (element_type *)*puVar3;
          }
          local_118._8_8_ = puVar3[1];
          *puVar3 = peVar9;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar1,(string *)local_118);
          if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                    ((((local_f8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,model);
          Issue::IssueImpl::setReferenceRule
                    ((local_f8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,ENCAPSULATION_CHILD);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_f8);
          _Var12._M_pi = local_f8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
        }
        else {
LAB_00234597:
          ComponentEntity::addComponent
                    (&((model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_ComponentEntity,&local_78);
          sVar4 = ComponentEntity::componentCount
                            (&(local_78.
                               super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->super_ComponentEntity);
          if (sVar4 != 0) goto LAB_002348d1;
          Issue::IssueImpl::create();
          pIVar1 = (local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->mPimpl;
          NamedEntity::name_abi_cxx11_
                    ((string *)&local_98,
                     (NamedEntity *)
                     (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x2a64db);
          local_f8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_e8;
          peVar8 = (element_type *)(plVar5 + 2);
          if ((element_type *)*plVar5 == peVar8) {
            local_e8._vptr_Issue = peVar8->_vptr_Issue;
            local_e8.mPimpl = (IssueImpl *)plVar5[3];
          }
          else {
            local_e8._vptr_Issue = peVar8->_vptr_Issue;
            local_f8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar5;
          }
          local_f8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
          *plVar5 = (long)peVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          puVar10 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_138.field_2._M_allocated_capacity = *puVar10;
            local_138.field_2._8_8_ = plVar5[3];
          }
          else {
            local_138.field_2._M_allocated_capacity = *puVar10;
            local_138._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_138._M_string_length = plVar5[1];
          *plVar5 = (long)puVar10;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          NamedEntity::name_abi_cxx11_
                    ((string *)(local_c8 + 0x10),
                     (NamedEntity *)
                     local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          uVar11 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            uVar11 = local_138.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar11 < local_b0 + local_138._M_string_length) {
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._16_8_ != &local_a8) {
              uVar11 = local_a8._M_allocated_capacity;
            }
            if ((ulong)uVar11 < local_b0 + local_138._M_string_length) goto LAB_0023470a;
            puVar3 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)(local_c8 + 0x10),0,(char *)0x0,
                                (ulong)local_138._M_dataplus._M_p);
          }
          else {
LAB_0023470a:
            puVar3 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_138,local_c8._16_8_);
          }
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar6 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_158.field_2._M_allocated_capacity = *psVar6;
            local_158.field_2._8_8_ = puVar3[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar6;
            local_158._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_158._M_string_length = puVar3[1];
          *puVar3 = psVar6;
          puVar3[1] = 0;
          *(undefined1 *)psVar6 = 0;
          puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
          local_118._0_8_ = local_118 + 0x10;
          peVar9 = (element_type *)(puVar3 + 2);
          if ((element_type *)*puVar3 == peVar9) {
            local_118._16_8_ =
                 (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity
                 ._vptr_Entity;
            puStack_100 = (pointer)puVar3[3];
          }
          else {
            local_118._16_8_ =
                 (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity
                 ._vptr_Entity;
            local_118._0_8_ = (element_type *)*puVar3;
          }
          local_118._8_8_ = puVar3[1];
          *puVar3 = peVar9;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar1,(string *)local_118);
          if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._16_8_ != &local_a8) {
            operator_delete((void *)local_c8._16_8_,local_a8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if (local_f8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_e8) {
            operator_delete(local_f8.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (long)local_e8._vptr_Issue + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_allocated_capacity != &local_88) {
            operator_delete((void *)local_98._M_allocated_capacity,
                            local_88._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                    ((((local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,model);
          Issue::IssueImpl::setReferenceRule
                    ((local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,ENCAPSULATION_CHILD);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_d8);
          _Var12._M_pi = local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
        }
        if ((pointer)_Var12._M_pi != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var12._M_pi);
        }
LAB_002348d1:
        XmlNode::next((XmlNode *)local_118);
        uVar11 = local_c8._8_8_;
        local_c8._8_8_ = local_118._8_8_;
        local_c8._0_8_ = local_118._0_8_;
        local_118._0_8_ = (element_type *)0x0;
        local_118._8_8_ = (pointer)0x0;
        if (((pointer)uVar11 != (pointer)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11),
           (pointer)local_118._8_8_ != (pointer)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
        }
      }
      if (local_68 != &local_58) {
        operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
      }
      if ((pointer)local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_c8._0_8_ !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void Parser::ParserImpl::loadEncapsulation(const ModelPtr &model, const XmlNodePtr &node)
{
    NameList usedNames;
    XmlNodePtr componentRefNode = node->firstChild();
    while (componentRefNode != nullptr) {
        ComponentPtr parentComponent = nullptr;
        std::string encapsulationId;
        bool haveComponentRef = false;
        if (parseNode(componentRefNode, "component_ref")) {
            haveComponentRef = true;
            parentComponent = loadComponentRef(model, componentRefNode, usedNames);
        } else if (componentRefNode->isText()) {
            const std::string textNode = componentRefNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            } else {
                // Continue to next node if this is whitespace (don't try to parse children of whitespace).
                componentRefNode = componentRefNode->next();
                continue;
            }
        } else if (componentRefNode->isComment()) {
            // Do nothing.
        } else if (mParsing1XVersion && componentRefNode->isCellml1XElement("relationship_ref")) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid child element '" + componentRefNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_CHILD);
            addIssue(issue);
        }

        // Add the parentComponent to the model with its child(ren) encapsulated.
        if (parentComponent) {
            model->addComponent(parentComponent);
            if (parentComponent->componentCount() == 0) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' specifies '" + parentComponent->name() + "' as a parent component_ref but it does not have any children.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_CHILD);
                addIssue(issue);
            }
        } else if (haveComponentRef) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' specifies an invalid parent component_ref that also does not have any children.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_CHILD);
            addIssue(issue);
        }

        componentRefNode = componentRefNode->next();
    }
}